

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

uint32_t inform_dist_set(inform_dist *dist,size_t event,uint32_t x)

{
  uint32_t x_local;
  size_t event_local;
  inform_dist *dist_local;
  
  if ((dist == (inform_dist *)0x0) || (dist->size <= event)) {
    dist_local._4_4_ = 0;
  }
  else {
    dist->counts = dist->counts - (ulong)dist->histogram[event];
    dist->counts = (ulong)x + dist->counts;
    dist->histogram[event] = x;
    dist_local._4_4_ = x;
  }
  return dist_local._4_4_;
}

Assistant:

uint32_t inform_dist_set(inform_dist *dist, size_t event, uint32_t x)
{
    // if the distribution is NULL or the event is outsize of the support
    if (dist == NULL || event >= dist->size)
    {
        return 0;
    }
    // otherwise decrement counts by the old number of occurances
    dist->counts -= dist->histogram[event];
    // increment counts by the new number of occurances
    dist->counts += x;
    // set and return the new number of occurances of the event
    return (dist->histogram[event] = x);
}